

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::UpdateMetadata
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t insertion_length,size_t indent_length)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  GeneratorContextImpl *pGVar4;
  pointer pcVar5;
  GeneratedCodeInfo_Annotation *from;
  bool bVar6;
  bool bVar7;
  iterator iVar8;
  ostream *poVar9;
  GeneratedCodeInfo_Annotation *pGVar10;
  long lVar11;
  void **ppvVar12;
  _Base_ptr data;
  long lVar13;
  long lVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar15;
  GeneratedCodeInfo new_metadata;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  GeneratedCodeInfo metadata;
  undefined1 local_c8 [32];
  _Alloc_hider local_a8;
  int local_98 [4];
  size_t local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  GeneratedCodeInfo local_60;
  
  pGVar4 = this->directory_;
  pcVar1 = local_c8 + 0x10;
  pcVar5 = (this->filename_)._M_dataplus._M_p;
  local_c8._0_8_ = pcVar1;
  local_88 = insertion_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar5,pcVar5 + (this->filename_)._M_string_length);
  std::__cxx11::string::append((char *)local_c8);
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(pGVar4->files_)._M_t,(key_type *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (((_Rb_tree_header *)iVar8._M_node ==
       &(this->directory_->files_)._M_t._M_impl.super__Rb_tree_header) &&
     ((this->info_to_insert_).annotation_.super_RepeatedPtrFieldBase.current_size_ == 0)) {
    return;
  }
  GeneratedCodeInfo::GeneratedCodeInfo(&local_60,(Arena *)0x0,false);
  pGVar4 = this->directory_;
  if ((_Rb_tree_header *)iVar8._M_node == &(pGVar4->files_)._M_t._M_impl.super__Rb_tree_header) {
    pcVar5 = (this->filename_)._M_dataplus._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar5,pcVar5 + (this->filename_)._M_string_length);
    std::__cxx11::string::append((char *)&local_80);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[1],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c8,&local_80,(char (*) [1])0x3d75d9);
    pVar15 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)&pGVar4->files_,
                        (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_c8);
    if ((int *)local_a8._M_p != local_98) {
      operator_delete(local_a8._M_p);
    }
    if ((pointer)local_c8._0_8_ != pcVar1) {
      operator_delete((void *)local_c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    data = pVar15.first._M_node._M_node + 2;
LAB_0022d1e5:
    bVar6 = false;
  }
  else {
    data = iVar8._M_node + 2;
    bVar6 = MessageLite::ParseFromString((MessageLite *)&local_60,(ConstStringParam)data);
    if (bVar6) goto LAB_0022d1e5;
    bVar7 = TextFormat::ParseFromString((ConstStringParam)data,&local_60.super_Message);
    bVar6 = true;
    if (!bVar7) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                          (this->filename_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,".pb.meta: Could not parse metadata as wire or text format.",0x3a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      goto LAB_0022d34d;
    }
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_c8,(Arena *)0x0,false);
  ppvVar12 = (local_60.annotation_.super_RepeatedPtrFieldBase.rep_)->elements;
  if (local_60.annotation_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
    ppvVar12 = (void **)0x0;
  }
  if ((long)local_60.annotation_.super_RepeatedPtrFieldBase.current_size_ == 0) {
LAB_0022d303:
    InsertShiftedInfo(this,insertion_content,insertion_offset,indent_length,
                      (GeneratedCodeInfo *)local_c8);
  }
  else {
    lVar14 = 0;
    lVar13 = 0;
    bVar7 = false;
    do {
      from = *(GeneratedCodeInfo_Annotation **)((long)ppvVar12 + lVar14);
      if ((insertion_offset <= (ulong)(long)from->begin_) && (!bVar7)) {
        InsertShiftedInfo(this,insertion_content,insertion_offset,indent_length,
                          (GeneratedCodeInfo *)local_c8);
        lVar13 = lVar13 + local_88;
        bVar7 = true;
      }
      if (((int *)local_a8._M_p == (int *)0x0) ||
         (lVar11 = (long)(int)local_c8._24_4_, *(int *)local_a8._M_p <= (int)local_c8._24_4_)) {
        pGVar10 = Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo_Annotation>
                            ((Arena *)local_c8._16_8_);
        pGVar10 = (GeneratedCodeInfo_Annotation *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            ((RepeatedPtrFieldBase *)(local_c8 + 0x10),pGVar10);
      }
      else {
        local_c8._24_4_ = local_c8._24_4_ + 1;
        pGVar10 = *(GeneratedCodeInfo_Annotation **)(local_a8._M_p + lVar11 * 8 + 8);
      }
      GeneratedCodeInfo_Annotation::CopyFrom(pGVar10,from);
      *(byte *)(pGVar10->_has_bits_).has_bits_ = (byte)(pGVar10->_has_bits_).has_bits_[0] | 6;
      uVar2 = pGVar10->begin_;
      uVar3 = pGVar10->end_;
      pGVar10->begin_ = (int)lVar13 + uVar2;
      pGVar10->end_ = (int)lVar13 + uVar3;
      lVar14 = lVar14 + 8;
    } while ((long)local_60.annotation_.super_RepeatedPtrFieldBase.current_size_ * 8 != lVar14);
    if (!bVar7) goto LAB_0022d303;
  }
  if (bVar6) {
    TextFormat::PrintToString((Message *)local_c8,(string *)data);
  }
  else {
    MessageLite::SerializeToString((MessageLite *)local_c8,(string *)data);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_c8);
LAB_0022d34d:
  GeneratedCodeInfo::~GeneratedCodeInfo(&local_60);
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::UpdateMetadata(
    const std::string& insertion_content, size_t insertion_offset,
    size_t insertion_length, size_t indent_length) {
  auto it = directory_->files_.find(filename_ + ".pb.meta");
  if (it == directory_->files_.end() && info_to_insert_.annotation().empty()) {
    // No metadata was recorded for this file.
    return;
  }
  GeneratedCodeInfo metadata;
  bool is_text_format = false;
  std::string* encoded_data = nullptr;
  if (it != directory_->files_.end()) {
    encoded_data = &it->second;
    // Try to decode a GeneratedCodeInfo proto from the .pb.meta file. It may be
    // in wire or text format. Keep the same format when the data is written out
    // later.
    if (!metadata.ParseFromString(*encoded_data)) {
      if (!TextFormat::ParseFromString(*encoded_data, &metadata)) {
        // The metadata is invalid.
        std::cerr
            << filename_
            << ".pb.meta: Could not parse metadata as wire or text format."
            << std::endl;
        return;
      }
      // Generators that use the public plugin interface emit text-format
      // metadata (because in the public plugin protocol, file content must be
      // UTF8-encoded strings).
      is_text_format = true;
    }
  } else {
    // Create a new file to store the new metadata in info_to_insert_.
    encoded_data =
        &directory_->files_.insert({filename_ + ".pb.meta", ""}).first->second;
  }
  GeneratedCodeInfo new_metadata;
  bool crossed_offset = false;
  size_t to_add = 0;
  for (const auto& source_annotation : metadata.annotation()) {
    // The first time an annotation at or after the insertion point is found,
    // insert the new metadata from info_to_insert_. Shift all annotations
    // after the new metadata by the length of the text that was inserted
    // (including any additional indent length).
    if (source_annotation.begin() >= insertion_offset && !crossed_offset) {
      crossed_offset = true;
      InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                        new_metadata);
      to_add += insertion_length;
    }
    GeneratedCodeInfo::Annotation* annotation = new_metadata.add_annotation();
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + to_add);
    annotation->set_end(annotation->end() + to_add);
  }
  // If there were never any annotations at or after the insertion point,
  // make sure to still insert the new metadata from info_to_insert_.
  if (!crossed_offset) {
    InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                      new_metadata);
  }
  if (is_text_format) {
    TextFormat::PrintToString(new_metadata, encoded_data);
  } else {
    new_metadata.SerializeToString(encoded_data);
  }
}